

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct::InnerProduct(InnerProduct *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__InnerProduct_001c8778;
  Mat::Mat((Mat *)(in_RDI + 0x13));
  Mat::Mat((Mat *)(in_RDI + 0x1b));
  Mat::Mat((Mat *)(in_RDI + 0x23));
  Mat::Mat((Mat *)(in_RDI + 0x2b));
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x15f13d);
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  in_RDI[0x34] = 0;
  return;
}

Assistant:

InnerProduct::InnerProduct()
{
    one_blob_only = true;
    support_inplace = false;

    quantize = 0;
}